

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meter.cc
# Opt level: O1

double __thiscall
fasttext::Meter::recallAtPrecision(Meter *this,int32_t labelId,double precisionQuery)

{
  pointer ppVar1;
  double dVar2;
  undefined1 auVar3 [64];
  undefined1 auVar4 [16];
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> local_20;
  
  precisionRecallCurve(&local_20,this,labelId);
  auVar3 = ZEXT864(0) << 0x40;
  dVar2 = 0.0;
  for (ppVar1 = local_20.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar1 != local_20.
                super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar1 = ppVar1 + 1) {
    if (precisionQuery <= ppVar1->first) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = ppVar1->second;
      auVar4 = vmaxsd_avx(auVar4,auVar3._0_16_);
      auVar3 = ZEXT1664(auVar4);
    }
    dVar2 = auVar3._0_8_;
  }
  if (local_20.
      super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_20.
                    super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_20.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.
                          super__Vector_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return dVar2;
}

Assistant:

double Meter::recallAtPrecision(int32_t labelId, double precisionQuery) const {
  const auto& precisionRecall = precisionRecallCurve(labelId);
  double bestRecall = 0.0;
  std::for_each(
      precisionRecall.begin(),
      precisionRecall.end(),
      [&bestRecall, precisionQuery](const std::pair<double, double>& element) {
        if (element.first >= precisionQuery) {
          bestRecall = std::max(bestRecall, element.second);
        };
      });
  return bestRecall;
}